

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

char doBackslash(char c)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,c);
  switch(iVar1) {
  case 0x6e:
    return '\n';
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x75:
    goto switchD_00107a73_caseD_6f;
  case 0x72:
    return '\r';
  case 0x74:
    return '\t';
  case 0x76:
    return '\v';
  default:
    if (((iVar1 != 0x22) && (iVar1 != 0x27)) && (iVar1 != 0x5c)) {
      if (iVar1 == 0x61) {
        return '\a';
      }
      if (iVar1 == 0x62) {
        return '\b';
      }
      if (iVar1 == 0x66) {
        iVar1 = 0xc;
      }
    }
switchD_00107a73_caseD_6f:
    return (char)iVar1;
  }
}

Assistant:

char doBackslash(char c) {
    switch (c) {
        case 't':
            return '\t';
        case 'n':
            return '\n';
        case 'a':
            return '\a';
        case 'b':
            return '\b';
        case 'r':
            return '\r';
        case 'v':
            return '\v';
        case 'f':
            return '\f';
        case '"':
            return '"';
        case '\\':
            return '\\';
        case '\'':
            return '\'';
        default:
            return c;
    }
}